

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

rule * Rule_sort(rule *rp)

{
  rule *prVar1;
  bool bVar2;
  rule *local_128;
  rule *x [32];
  rule *pNext;
  rule *prStack_10;
  uint i;
  rule *rp_local;
  
  memset(&local_128,0,0x100);
  prStack_10 = rp;
  while (prStack_10 != (rule *)0x0) {
    prVar1 = prStack_10->next;
    prStack_10->next = (rule *)0x0;
    pNext._4_4_ = 0;
    while( true ) {
      bVar2 = false;
      if (pNext._4_4_ < 0x1f) {
        bVar2 = x[(ulong)pNext._4_4_ - 1] != (rule *)0x0;
      }
      if (!bVar2) break;
      prStack_10 = Rule_merge(x[(ulong)pNext._4_4_ - 1],prStack_10);
      x[(ulong)pNext._4_4_ - 1] = (rule *)0x0;
      pNext._4_4_ = pNext._4_4_ + 1;
    }
    x[(ulong)pNext._4_4_ - 1] = prStack_10;
    prStack_10 = prVar1;
  }
  prStack_10 = (rule *)0x0;
  for (pNext._4_4_ = 0; pNext._4_4_ < 0x20; pNext._4_4_ = pNext._4_4_ + 1) {
    prStack_10 = Rule_merge(x[(ulong)pNext._4_4_ - 1],prStack_10);
  }
  return prStack_10;
}

Assistant:

static struct rule *Rule_sort(struct rule *rp){
  unsigned int i;
  struct rule *pNext;
  struct rule *x[32];
  memset(x, 0, sizeof(x));
  while( rp ){
    pNext = rp->next;
    rp->next = 0;
    for(i=0; i<sizeof(x)/sizeof(x[0])-1 && x[i]; i++){
      rp = Rule_merge(x[i], rp);
      x[i] = 0;
    }
    x[i] = rp;
    rp = pNext;
  }
  rp = 0;
  for(i=0; i<sizeof(x)/sizeof(x[0]); i++){
    rp = Rule_merge(x[i], rp);
  }
  return rp;
}